

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

re2 * __thiscall re2::FormatCapture_abi_cxx11_(re2 *this,StringPiece *text,StringPiece *s)

{
  iterator pcVar1;
  iterator pcVar2;
  iterator pcVar3;
  iterator pcVar4;
  allocator local_21;
  StringPiece *local_20;
  StringPiece *s_local;
  StringPiece *text_local;
  
  local_20 = s;
  s_local = text;
  text_local = (StringPiece *)this;
  pcVar1 = StringPiece::begin(s);
  if (pcVar1 == (iterator)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"(?,?)",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    pcVar1 = StringPiece::begin(local_20);
    pcVar2 = StringPiece::begin(s_local);
    pcVar3 = StringPiece::end(local_20);
    pcVar4 = StringPiece::begin(s_local);
    StringPrintf_abi_cxx11_
              ((char *)this,"(%d,%d)",(ulong)(uint)((int)pcVar1 - (int)pcVar2),
               (ulong)(uint)((int)pcVar3 - (int)pcVar4));
  }
  return this;
}

Assistant:

static string FormatCapture(const StringPiece& text, const StringPiece& s) {
  if (s.begin() == NULL)
    return "(?,?)";
  return StringPrintf("(%d,%d)",
                      static_cast<int>(s.begin() - text.begin()),
                      static_cast<int>(s.end() - text.begin()));
}